

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
::rebalance_after_delete
          (btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           *this,iterator iter)

{
  bool bVar1;
  bool bVar2;
  iterator iVar3;
  iterator res;
  iterator local_38;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  local_28;
  
  local_38.node = iter.node;
  local_38.position = iter.position;
  local_28.node = local_38.node;
  local_28.position = local_38.position;
  if ((this->root_).
      super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
      ._M_head_impl != local_38.node) {
    bVar2 = true;
    do {
      if (((ulong)local_38.node & 7) != 0) goto LAB_0020501c;
      if (0xe < (byte)local_38.node[10]) goto LAB_00204fdc;
      bVar1 = try_merge_or_rebalance(this,&local_38);
      if (bVar2) {
        local_28.position = local_38.position;
        local_28.node = local_38.node;
      }
      if (!bVar1) goto LAB_00204fdc;
      if (((ulong)local_38.node & 7) != 0) goto LAB_0020501c;
      local_38.position = (int)(byte)local_38.node[8];
      local_38.node =
           *(btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
             **)local_38.node;
      bVar2 = false;
    } while (local_38.node !=
             (this->root_).
             super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
             ._M_head_impl);
  }
  try_shrink(this);
  if (this->size_ == 0) {
    iVar3 = end(this);
  }
  else {
LAB_00204fdc:
    if (((ulong)local_28.node & 7) != 0) {
LAB_0020501c:
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,
                    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                   );
    }
    iVar3.position = local_28.position;
    iVar3.node = local_28.node;
    iVar3._12_4_ = 0;
    if (local_28.position == (uint)(byte)local_28.node[10]) {
      local_28.position = local_28.position - 1;
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
      ::increment(&local_28);
      iVar3.position = local_28.position;
      iVar3.node = local_28.node;
      iVar3._12_4_ = 0;
    }
  }
  return iVar3;
}

Assistant:

auto btree<P>::rebalance_after_delete(iterator iter) -> iterator {
        // Merge/rebalance as we walk back up the tree.
        iterator res(iter);
        bool first_iteration = true;
        for (;;) {
            if (iter.node == root()) {
                try_shrink();
                if (empty()) {
                    return end();
                }
                break;
            }
            if (iter.node->count() >= kMinNodeValues) {
                break;
            }
            bool merged = try_merge_or_rebalance(&iter);
            // On the first iteration, we should update `res` with `iter` because `res`
            // may have been invalidated.
            if (first_iteration) {
                res = iter;
                first_iteration = false;
            }
            if (!merged) {
                break;
            }
            iter.position = iter.node->position();
            iter.node = iter.node->parent();
        }

        // Adjust our return value. If we're pointing at the end of a node, advance
        // the iterator.
        if (res.position == res.node->count()) {
            res.position = res.node->count() - 1;
            ++res;
        }

        return res;
    }